

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueScanner::SetStart(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *psVar1;
  CSVIterator *current_iterator;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  ulong uVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  CSVBufferHandle *pCVar9;
  CSVBufferManager *pCVar10;
  CSVStateMachineCache *this_02;
  CSVStateMachine *pCVar11;
  StateMachine *__args;
  undefined8 uVar12;
  CSVStateMachine *__tmp;
  ValidRowInfo quoted_row;
  ValidRowInfo best_row;
  undefined1 local_91;
  ValidRowInfo local_90;
  undefined1 local_68 [8];
  _Alloc_hider _Stack_60;
  idx_t local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  undefined8 local_40;
  CSVOption<bool> local_38;
  
  this->start_pos =
       (this->super_BaseScanner).iterator.pos.buffer_idx *
       (this->super_BaseScanner).iterator.buffer_size +
       (this->super_BaseScanner).iterator.pos.buffer_pos;
  if ((this->super_BaseScanner).iterator.first_one == true) {
    if ((this->result).store_line_size != true) {
      return;
    }
    CSVErrorHandler::NewMaxLineSize
              ((this->result).error_handler,(this->super_BaseScanner).iterator.pos.buffer_pos);
    return;
  }
  uVar2 = (this->super_BaseScanner).iterator.boundary.end_pos;
  this_00 = &(this->super_BaseScanner).cur_buffer_handle;
  pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
  if (pCVar9->actual_size < uVar2) {
    pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    (this->super_BaseScanner).iterator.boundary.end_pos = pCVar9->actual_size;
  }
  if ((this->state_machine_strict).internal.
      super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar10 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                        (&(this->super_BaseScanner).buffer_manager);
    this_02 = CSVStateMachineCache::Get(pCVar10->context);
    psVar1 = &(this->super_BaseScanner).state_machine;
    pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    local_68[0] = (pCVar11->state_machine_options).delimiter.set_by_user;
    pcVar3 = (pCVar11->state_machine_options).delimiter.value._M_dataplus._M_p;
    _Stack_60._M_p = (pointer)&aStack_50;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_60,pcVar3,
               pcVar3 + (pCVar11->state_machine_options).delimiter.value._M_string_length);
    local_38 = (pCVar11->state_machine_options).strict_mode;
    local_40._0_2_ = (pCVar11->state_machine_options).quote;
    local_40._2_2_ = (pCVar11->state_machine_options).escape;
    local_40._4_2_ = (pCVar11->state_machine_options).comment;
    local_40._6_2_ = (pCVar11->state_machine_options).new_line;
    if (((ushort)local_38 & 1) == 0) {
      local_38.set_by_user = false;
      local_38.value = true;
    }
    __args = CSVStateMachineCache::Get(this_02,(CSVStateMachineOptions *)local_68);
    pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    local_90._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::CSVStateMachine,std::allocator<duckdb::CSVStateMachine>,duckdb::StateMachine_const&,duckdb::CSVReaderOptions_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90.start_pos,
               (CSVStateMachine **)&local_90,(allocator<duckdb::CSVStateMachine> *)&local_91,__args,
               pCVar11->options);
    iVar4 = local_90.start_pos;
    uVar12 = local_90._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.start_pos !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_90.start_pos + 8) = *(int *)(local_90.start_pos + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_90.start_pos + 8) = *(int *)(local_90.start_pos + 8) + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.start_pos !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.start_pos);
    }
    (this->state_machine_strict).internal.
    super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar12;
    this_01 = (this->state_machine_strict).internal.
              super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->state_machine_strict).internal.
    super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar4;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_60._M_p != &aStack_50) {
      operator_delete(_Stack_60._M_p);
    }
  }
  current_iterator = &(this->super_BaseScanner).iterator;
  TryRow((ValidRowInfo *)local_68,this,STANDARD_NEWLINE,
         (this->super_BaseScanner).iterator.pos.buffer_pos,
         (this->super_BaseScanner).iterator.boundary.end_pos);
  psVar1 = &(this->super_BaseScanner).state_machine;
  pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
  if ((pCVar11->dialect_options).state_machine_options.quote.value != '\0') {
    uVar12 = (this->super_BaseScanner).iterator.boundary.end_pos;
    bVar8 = (bool)local_68[0];
    if (((bool)local_68[0] == true) && (local_58 == (current_iterator->pos).buffer_idx)) {
      uVar12 = aStack_50._M_allocated_capacity;
    }
    TryRow(&local_90,this,QUOTED,(this->super_BaseScanner).iterator.pos.buffer_pos,uVar12);
    if ((local_90.is_valid == true) && ((bVar8 == false || (aStack_50._M_local_buf[8] == '\x01'))))
    {
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
    if (((bool)local_68[0] == false && local_90.is_valid == false) &&
       (_Stack_60._M_p < local_90.start_pos)) {
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
    if ((local_90.is_valid != false) && (local_90.start_pos < _Stack_60._M_p)) {
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
  }
  if ((((bool)local_68[0] == false) &&
      (pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
      (pCVar11->dialect_options).state_machine_options.escape.value != '\0')) &&
     (pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
     (pCVar11->dialect_options).state_machine_options.quote.value != '\0')) {
    TryRow(&local_90,this,ESCAPE,(this->super_BaseScanner).iterator.pos.buffer_pos,
           (this->super_BaseScanner).iterator.boundary.end_pos);
    if ((local_90.is_valid != false) || (_Stack_60._M_p < local_90.start_pos)) {
      aStack_50._M_local_buf[8] = local_90.last_state_quote;
      local_58 = local_90.end_buffer_idx;
      aStack_50._M_allocated_capacity = local_90.end_pos;
      local_68 = (undefined1  [8])local_90._0_8_;
      _Stack_60._M_p = (pointer)local_90.start_pos;
    }
  }
  _Var7._M_p = _Stack_60._M_p;
  if ((bool)local_68[0] == false) {
    pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((_Var7._M_p <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pCVar9->actual_size) ||
       (pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar9->is_last_buffer != true)) {
      bVar8 = SkipUntilState(this,STANDARD_NEWLINE,RECORD_SEPARATOR,current_iterator,
                             &local_90.is_valid);
      if (((bVar8) || ((this->super_BaseScanner).iterator.is_set != true)) ||
         (((this->super_BaseScanner).iterator.pos.buffer_idx <=
           (this->super_BaseScanner).iterator.boundary.buffer_idx &&
          ((this->super_BaseScanner).iterator.pos.buffer_pos <=
           (this->super_BaseScanner).iterator.boundary.buffer_pos)))) goto LAB_015107fc;
    }
    else {
      (this->super_BaseScanner).iterator.pos.buffer_pos = (idx_t)_Var7._M_p;
    }
  }
  else {
    (this->super_BaseScanner).iterator.pos.buffer_pos = (idx_t)_Stack_60._M_p;
    pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((_Var7._M_p <
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pCVar9->actual_size) ||
       (pCVar9 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar9->is_last_buffer != true)) goto LAB_015107fc;
  }
  (this->super_BaseScanner).iterator.done = true;
LAB_015107fc:
  iVar4 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar5 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  iVar6 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar5;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar6;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar4;
  this->start_pos = iVar4 * (this->super_BaseScanner).iterator.buffer_size + iVar5;
  return;
}

Assistant:

void StringValueScanner::SetStart() {
	start_pos = iterator.GetGlobalCurrentPos();
	if (iterator.first_one) {
		if (result.store_line_size) {
			result.error_handler.NewMaxLineSize(iterator.pos.buffer_pos);
		}
		return;
	}
	if (iterator.GetEndPos() > cur_buffer_handle->actual_size) {
		iterator.SetEnd(cur_buffer_handle->actual_size);
	}
	if (!state_machine_strict) {
		// We need to initialize our strict state machine
		auto &state_machine_cache = CSVStateMachineCache::Get(buffer_manager->context);
		auto state_options = state_machine->state_machine_options;
		// To set the state machine to be strict we ensure that strict_mode is set to true
		if (!state_options.strict_mode.IsSetByUser()) {
			state_options.strict_mode = true;
		}
		state_machine_strict =
		    make_shared_ptr<CSVStateMachine>(state_machine_cache.Get(state_options), state_machine->options);
	}
	// At this point we have 3 options:
	// 1. We are at the start of a valid line
	ValidRowInfo best_row = TryRow(CSVState::STANDARD_NEWLINE, iterator.pos.buffer_pos, iterator.GetEndPos());
	// 2. We are in the middle of a quoted value
	if (state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		idx_t end_pos = iterator.GetEndPos();
		if (best_row.is_valid && best_row.end_buffer_idx == iterator.pos.buffer_idx) {
			// If we got a valid row from the standard state, we limit our search up to that.
			end_pos = best_row.end_pos;
		}
		auto quoted_row = TryRow(CSVState::QUOTED, iterator.pos.buffer_pos, end_pos);
		if (quoted_row.is_valid && (!best_row.is_valid || best_row.last_state_quote)) {
			best_row = quoted_row;
		}
		if (!best_row.is_valid && !quoted_row.is_valid && best_row.start_pos < quoted_row.start_pos) {
			best_row = quoted_row;
		}
		if (quoted_row.is_valid && quoted_row.start_pos < best_row.start_pos) {
			best_row = quoted_row;
		}
	}
	// 3. We are in an escaped value
	if (!best_row.is_valid && state_machine->dialect_options.state_machine_options.escape.GetValue() != '\0' &&
	    state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		auto escape_row = TryRow(CSVState::ESCAPE, iterator.pos.buffer_pos, iterator.GetEndPos());
		if (escape_row.is_valid) {
			best_row = escape_row;
		} else {
			if (best_row.start_pos < escape_row.start_pos) {
				best_row = escape_row;
			}
		}
	}
	if (!best_row.is_valid) {
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.pos.buffer_pos = best_row.start_pos;
			iterator.done = true;
		} else {
			bool mock;
			if (!SkipUntilState(CSVState::STANDARD_NEWLINE, CSVState::RECORD_SEPARATOR, iterator, mock)) {
				iterator.CheckIfDone();
			}
		}
	} else {
		iterator.pos.buffer_pos = best_row.start_pos;
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.done = true;
		}
	}

	// 4. We have an error, if we have an error, we let life go on, the scanner will either ignore it
	// or throw.
	result.last_position = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, result.buffer_size};
	start_pos = iterator.GetGlobalCurrentPos();
}